

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_p_rob3.cpp
# Opt level: O0

double IKacos(double f)

{
  ostream *poVar1;
  runtime_error *this;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  double local_18;
  double f_local;
  
  local_18 = f;
  if ((-1.0000001 < f) && (f < 1.0000001)) {
    if (-1.0 < f) {
      if (f < 1.0) {
        f_local = acos(f);
      }
      else {
        f_local = 0.0;
      }
    }
    else {
      f_local = 3.14159265358979;
    }
    return f_local;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"ikfast exception: ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/src/p_rob3/ikfast61_p_rob3.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa5);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,"IKacos");
  poVar1 = std::operator<<(poVar1,": Assertion \'");
  poVar1 = std::operator<<(poVar1,"f > -1-IKFAST_SINCOS_THRESH && f < 1+IKFAST_SINCOS_THRESH");
  std::operator<<(poVar1,"\' failed");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this,local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline double IKacos(double f)
{
IKFAST_ASSERT( f > -1-IKFAST_SINCOS_THRESH && f < 1+IKFAST_SINCOS_THRESH ); // any more error implies something is wrong with the solver
if( f <= -1 ) return IKPI;
else if( f >= 1 ) return 0;
return acos(f);
}